

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapFields
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  ReflectionSchema *this_00;
  _Rb_tree_color _Var1;
  FieldDescriptor *field;
  long lVar2;
  _Base_ptr p_Var3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  undefined4 extraout_var;
  LogMessage *pLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var8;
  uint uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  ulong uVar12;
  bool bVar13;
  int oneof_index;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  int local_84;
  Message *local_80;
  GeneratedMessageReflection *local_78;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_70;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  _Alloc_hider local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (message1 != message2) {
    local_80 = message2;
    local_70 = fields;
    iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x16])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar4) != this) {
      LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x29d);
      pLVar7 = LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar7 = LogMessage::operator<<(pLVar7,"First argument to SwapFields() (of type \"");
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x17])(message1);
      pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(CONCAT44(extraout_var_00,iVar4) + 8));
      pLVar7 = LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_84,pLVar7);
      LogMessage::~LogMessage((LogMessage *)local_68);
    }
    iVar4 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x16])();
    local_78 = this;
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar4) != this) {
      LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a4);
      pLVar7 = LogMessage::operator<<
                         ((LogMessage *)local_68,
                          "CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar7 = LogMessage::operator<<(pLVar7,"Second argument to SwapFields() (of type \"");
      iVar4 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x17])();
      pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(CONCAT44(extraout_var_02,iVar4) + 8));
      pLVar7 = LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&local_84,pLVar7);
      LogMessage::~LogMessage((LogMessage *)local_68);
    }
    local_50._M_p = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_58 = (_Base_ptr)0x0;
    local_40._M_allocated_capacity = 0;
    uVar9 = (uint)((ulong)((long)(local_70->
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_70->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = (_Base_ptr)local_50._M_p;
    if (0 < (int)uVar9) {
      this_00 = &local_78->schema_;
      uVar12 = 0;
      do {
        field = (local_70->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar12];
        if (field[0x50] == (FieldDescriptor)0x1) {
          uVar5 = ReflectionSchema::GetExtensionSetOffset(this_00);
          uVar6 = ReflectionSchema::GetExtensionSetOffset(this_00);
          ExtensionSet::SwapExtension
                    ((ExtensionSet *)
                     ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                     (ExtensionSet *)
                     ((long)&(local_80->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                     *(int *)(field + 0x38));
        }
        else {
          lVar2 = *(long *)(field + 0x60);
          if (lVar2 == 0) {
            if (*(int *)(field + 0x4c) != 3) {
              SwapBit(local_78,message1,local_80,field);
            }
            SwapField(local_78,message1,local_80,field);
          }
          else {
            iVar4 = (int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x40)) >> 4);
            local_84 = iVar4 * -0x55555555;
            if (local_58 != (_Base_ptr)0x0) {
              p_Var3 = local_58;
              p_Var11 = (_Base_ptr)(local_68 + 8);
              do {
                p_Var10 = p_Var11;
                p_Var8 = p_Var3;
                _Var1 = p_Var8[1]._M_color;
                bVar13 = (int)(_Var1 + iVar4 * 0x55555555) < 0;
                p_Var11 = p_Var8;
                if (SBORROW4(_Var1,local_84) != bVar13) {
                  p_Var11 = p_Var10;
                }
                p_Var3 = (&p_Var8->_M_left)[SBORROW4(_Var1,local_84) != bVar13];
              } while ((&p_Var8->_M_left)[SBORROW4(_Var1,local_84) != bVar13] != (_Base_ptr)0x0);
              if (p_Var11 != (_Base_ptr)(local_68 + 8)) {
                if (SBORROW4(_Var1,local_84) != (int)(_Var1 + iVar4 * 0x55555555) < 0) {
                  p_Var8 = p_Var10;
                }
                if ((int)p_Var8[1]._M_color <= local_84) goto LAB_00316038;
              }
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_68,&local_84);
            SwapOneofField(local_78,message1,local_80,*(OneofDescriptor **)(field + 0x60));
          }
        }
LAB_00316038:
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar9 & 0x7fffffff));
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_68);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapFields(
    Message* message1,
    Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to SwapFields() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to SwapFields() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2),
          field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}